

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.h
# Opt level: O0

void __thiscall winmd::reader::RetTypeSig::RetTypeSig(RetTypeSig *this,RetTypeSig *param_1)

{
  RetTypeSig *param_1_local;
  RetTypeSig *this_local;
  
  cppwinrt::std::vector<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>::
  vector(&this->m_cmod,&param_1->m_cmod);
  this->m_byref = (bool)(param_1->m_byref & 1);
  cppwinrt::std::optional<winmd::reader::TypeSig>::optional(&this->m_type,&param_1->m_type);
  return;
}

Assistant:

RetTypeSig(table_base const* table, byte_view& data)
            : m_cmod(parse_cmods(table, data))
            , m_byref(is_by_ref(data))
        {
            auto cursor = data;
            auto element_type = uncompress_enum<ElementType>(cursor);
            if (element_type == ElementType::Void)
            {
                data = cursor;
            }
            else
            {
                m_type.emplace(table, data);
            }
        }